

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall gl4cts::CopyImage::ExceedingBoundariesTest::clean(ExceedingBoundariesTest *this)

{
  uint uVar1;
  GLenum GVar2;
  pointer ptVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GLuint local_38;
  GLuint local_34;
  
  uVar1 = this->m_test_case_index;
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GVar2 = ptVar3[uVar1].m_tex_target;
  _local_38 = CONCAT44((GLuint)((ulong)in_RAX >> 0x20),this->m_dst_tex_name);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)((ulong)(GVar2 != 0x8d41) * 0x20 + 0x460 + CONCAT44(extraout_var,iVar4)))(1,&local_38)
  ;
  GVar2 = ptVar3[uVar1].m_tex_target;
  _local_38 = CONCAT44(this->m_src_tex_name,local_38);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)((ulong)(GVar2 != 0x8d41) * 0x20 + 0x460 + CONCAT44(extraout_var_00,iVar4)))
            (1,&local_34);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  return;
}

Assistant:

void ExceedingBoundariesTest::clean()
{
	const testCase& test_case = m_test_cases[m_test_case_index];

	/* Clean textures and buffers. Errors ignored */
	Utils::deleteTexture(m_context, test_case.m_tex_target, m_dst_tex_name);
	Utils::deleteTexture(m_context, test_case.m_tex_target, m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;
}